

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O3

bool __thiscall Debugger::InstallDebugCallbacks(Debugger *this,JsValueRef hostDebugObject)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = WScriptJsrt::InstallObjectsOnObject(hostDebugObject,"JsDiagGetSource",GetSource);
  bVar2 = true;
  if (bVar1) {
    bVar1 = WScriptJsrt::InstallObjectsOnObject(hostDebugObject,"JsDiagSetBreakpoint",SetBreakpoint)
    ;
    if (bVar1) {
      bVar1 = WScriptJsrt::InstallObjectsOnObject
                        (hostDebugObject,"JsDiagGetStackTrace",GetStackTrace);
      if (bVar1) {
        bVar1 = WScriptJsrt::InstallObjectsOnObject
                          (hostDebugObject,"JsDiagGetBreakpoints",GetBreakpoints);
        if (bVar1) {
          bVar1 = WScriptJsrt::InstallObjectsOnObject
                            (hostDebugObject,"JsDiagRemoveBreakpoint",RemoveBreakpoint);
          if (bVar1) {
            bVar1 = WScriptJsrt::InstallObjectsOnObject
                              (hostDebugObject,"JsDiagSetBreakOnException",SetBreakOnException);
            if (bVar1) {
              bVar1 = WScriptJsrt::InstallObjectsOnObject
                                (hostDebugObject,"JsDiagGetBreakOnException",GetBreakOnException);
              if (bVar1) {
                bVar1 = WScriptJsrt::InstallObjectsOnObject
                                  (hostDebugObject,"JsDiagSetStepType",SetStepType);
                if (bVar1) {
                  bVar1 = WScriptJsrt::InstallObjectsOnObject
                                    (hostDebugObject,"JsDiagGetScripts",GetScripts);
                  if (bVar1) {
                    bVar1 = WScriptJsrt::InstallObjectsOnObject
                                      (hostDebugObject,"JsDiagGetStackProperties",GetStackProperties
                                      );
                    if (bVar1) {
                      bVar1 = WScriptJsrt::InstallObjectsOnObject
                                        (hostDebugObject,"JsDiagGetProperties",GetProperties);
                      if (bVar1) {
                        bVar1 = WScriptJsrt::InstallObjectsOnObject
                                          (hostDebugObject,"JsDiagGetObjectFromHandle",
                                           GetObjectFromHandle);
                        if (bVar1) {
                          bVar2 = WScriptJsrt::InstallObjectsOnObject
                                            (hostDebugObject,"JsDiagEvaluate",Evaluate);
                          bVar2 = !bVar2;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool Debugger::InstallDebugCallbacks(JsValueRef hostDebugObject)
{
    HRESULT hr = S_OK;
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetSource", Debugger::GetSource));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagSetBreakpoint", Debugger::SetBreakpoint));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetStackTrace", Debugger::GetStackTrace));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetBreakpoints", Debugger::GetBreakpoints));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagRemoveBreakpoint", Debugger::RemoveBreakpoint));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagSetBreakOnException", Debugger::SetBreakOnException));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetBreakOnException", Debugger::GetBreakOnException));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagSetStepType", Debugger::SetStepType));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetScripts", Debugger::GetScripts));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetStackProperties", Debugger::GetStackProperties));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetProperties", Debugger::GetProperties));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagGetObjectFromHandle", Debugger::GetObjectFromHandle));
    IfFalseGo(WScriptJsrt::InstallObjectsOnObject(hostDebugObject, "JsDiagEvaluate", Debugger::Evaluate));
Error:
    return hr != S_OK;
}